

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O0

float Llb_ManComputeCommonAttr(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  int local_24;
  int local_20;
  int CountDiff;
  int CountComm;
  int iVar;
  int iCol2_local;
  int iCol1_local;
  Llb_Mtr_t *p_local;
  
  local_20 = 0;
  local_24 = 0;
  for (CountDiff = 0; CountDiff < p->nRows - p->nFfs; CountDiff = CountDiff + 1) {
    if ((p->pMatrix[iCol1][CountDiff] == '\x01') && (p->pMatrix[iCol2][CountDiff] == '\x01')) {
      local_20 = local_20 + 1;
    }
    else if ((p->pMatrix[iCol1][CountDiff] == '\x01') || (p->pMatrix[iCol2][CountDiff] == '\x01')) {
      local_24 = local_24 + 1;
    }
  }
  return ((float)local_24 * -1.0) / (float)(local_20 + local_24);
}

Assistant:

float Llb_ManComputeCommonAttr( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int iVar, CountComm = 0, CountDiff = 0;
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    {
        if ( p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 1 )
            CountComm++;
        else if ( p->pMatrix[iCol1][iVar] == 1 || p->pMatrix[iCol2][iVar] == 1 )
            CountDiff++;
    }
/*
    printf( "Attr cost for %4d and %4d:  %4d %4d (%5.2f)\n", 
        iCol1, iCol2, 
        CountDiff, CountComm, 
        -1.0 * CountDiff / ( CountComm + CountDiff ) );
*/
    return -1.0 * CountDiff / ( CountComm + CountDiff );
}